

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall Belief::InnerProduct(Belief *this,VectorSet *v)

{
  ulong uVar1;
  size_type sVar2;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar3;
  const_reference pvVar4;
  reference pvVar5;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint s;
  uint k;
  double x;
  vector<double,_std::allocator<double>_> *values;
  value_type j;
  const_reference in_stack_ffffffffffffff78;
  allocator_type *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  undefined4 local_40;
  undefined4 local_3c;
  undefined8 local_38;
  
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::size1(in_RDX);
  std::allocator<double>::allocator((allocator<double> *)0x9b9a2f);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<double>::~allocator((allocator<double> *)0x9b9a4f);
  local_3c = 0;
  while( true ) {
    uVar1 = (ulong)local_3c;
    sVar2 = boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::size1(in_RDX);
    if (uVar1 == sVar2) break;
    local_38 = 0.0;
    local_40 = 0;
    while( true ) {
      this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)(ulong)local_40;
      pmVar3 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x10));
      if (this_00 == pmVar3) break;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x10),(ulong)local_40
                         );
      j = *pvVar4;
      in_stack_ffffffffffffff78 =
           boost::numeric::ublas::
           matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::operator()(this_00,(size_type)in_stack_ffffffffffffff78,(size_type)j);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = j;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *in_stack_ffffffffffffff78;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_38;
      auVar6 = vfmadd213sd_fma(auVar6,auVar7,auVar8);
      local_38 = auVar6._0_8_;
      local_40 = local_40 + 1;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)local_3c);
    *pvVar5 = local_38;
    local_3c = local_3c + 1;
  }
  return in_RDI;
}

Assistant:

vector<double> Belief::InnerProduct(const VectorSet &v) const
{
    vector<double> values(v.size1());

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        x=0;
        for(unsigned int s=0; s!=_m_b.size(); ++s)
            x+=_m_b[s]*v(k,s);
        values[k]=x;
    }

    return(values);
}